

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::
         write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,char decimal_point)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  appender aVar6;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  char cVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  bool pointy;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_76 [6];
  sign_t local_70;
  int local_6c;
  undefined1 local_68 [8];
  float_specs local_60;
  anon_class_56_7_a2a26a24 local_58;
  
  local_68._0_4_ = fp->significand;
  uVar2 = 0x1f;
  if ((local_68._0_4_ | 1) != 0) {
    for (; (local_68._0_4_ | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  local_6c = (int)((ulong)(uint)local_68._0_4_ +
                   *(long *)(count_digits_inc(int)::table + (ulong)uVar2 * 8) >> 0x20);
  uVar3 = fspecs._4_4_;
  local_70 = uVar3 >> 8 & 0xff;
  uVar9 = (ulong)((uint)(local_70 != none) + local_6c);
  uVar1 = fp->exponent;
  local_68._4_4_ = uVar1 + local_6c;
  iVar4 = fspecs.precision;
  local_76[0] = decimal_point;
  local_60 = fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_001123b4:
    iVar13 = uVar1 + local_6c + -1;
    if ((uVar3 >> 0x14 & 1) == 0) {
      uVar5 = 0;
      uVar12 = (ulong)(byte)decimal_point;
      if (local_6c == 1) {
        uVar12 = uVar5;
      }
      cVar11 = (char)uVar12;
    }
    else {
      uVar5 = 0;
      if (0 < iVar4 - local_6c) {
        uVar5 = (ulong)(uint)(iVar4 - local_6c);
      }
      uVar9 = uVar9 + uVar5;
      cVar11 = decimal_point;
    }
    local_58.sign = (sign_t *)(CONCAT44(local_68._0_4_,uVar3 >> 8) & 0xffffffff000000ff);
    local_58.significand._0_5_ = CONCAT14(cVar11,local_6c);
    local_58.significand_size =
         (int *)(CONCAT35(local_58.significand_size._5_3_,
                          CONCAT14(((uVar3 >> 0x10 & 1) == 0) << 5,(int)uVar5)) | 0x4500000000);
    local_58.fp = (decimal_fp<float> *)CONCAT44(local_58.fp._4_4_,iVar13);
    if (0 < specs->width) {
      if ((int)local_68._4_4_ < 1) {
        iVar13 = 1 - local_68._4_4_;
      }
      lVar10 = 2;
      if (99 < iVar13) {
        lVar10 = (ulong)(999 < iVar13) + 3;
      }
      sVar8 = uVar9 + (3 - (ulong)(cVar11 == '\0')) + lVar10;
      aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_1_&>
                        (out,specs,sVar8,sVar8,(anon_class_28_7_94dcc806 *)&local_58);
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar6 = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
            anon_class_28_7_94dcc806::operator()
                      ((anon_class_28_7_94dcc806 *)&local_58,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar13 = 0x10;
    if (0 < iVar4) {
      iVar13 = iVar4;
    }
    if (((int)local_68._4_4_ < -3) || (iVar13 < (int)local_68._4_4_)) goto LAB_001123b4;
  }
  if (-1 < (int)uVar1) {
    sVar8 = uVar9 + uVar1;
    local_76._2_4_ = iVar4 - local_68._4_4_;
    if ((uVar3 >> 0x14 & 1) != 0) {
      if ((fspecs._4_1_ == '\x02') || (0 < (int)local_76._2_4_)) {
        if ((int)local_76._2_4_ < 1) goto LAB_001124ee;
      }
      else {
        local_76._2_4_ = 1;
      }
      sVar8 = sVar8 + (uint)local_76._2_4_ + 1;
    }
LAB_001124ee:
    local_58.sign = &local_70;
    local_58.significand = (significand_type *)local_68;
    local_58.significand_size = &local_6c;
    local_58.fspecs = &local_60;
    local_58.decimal_point = local_76;
    local_58.num_zeros = (int *)(local_76 + 2);
    local_58.fp = fp;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_2_&>
                      (out,specs,sVar8,sVar8,&local_58);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (0 < (int)local_68._4_4_) {
    local_76._2_4_ = iVar4 - local_6c & (int)(uVar3 << 0xb) >> 0x1f;
    local_58.decimal_point = local_76 + 2;
    uVar5 = (ulong)(uint)local_76._2_4_;
    if ((int)local_76._2_4_ < 1) {
      uVar5 = 0;
    }
    sVar8 = uVar5 + 1 + uVar9;
    local_58.sign = &local_70;
    local_58.significand = (significand_type *)local_68;
    local_58.significand_size = &local_6c;
    local_58.fp = (decimal_fp<float> *)(local_68 + 4);
    local_58.fspecs = (float_specs *)local_76;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_3_&>
                      (out,specs,sVar8,sVar8,(anon_class_48_6_48d028d1 *)&local_58);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  iVar13 = -local_68._4_4_;
  local_76._2_4_ = iVar13;
  if (SBORROW4(iVar4,iVar13) != iVar4 + local_68._4_4_ < 0) {
    local_76._2_4_ = iVar4;
  }
  if (iVar4 < 0) {
    local_76._2_4_ = iVar13;
  }
  bVar14 = (ulong)(uint)local_68._0_4_ + *(long *)(count_digits_inc(int)::table + (ulong)uVar2 * 8)
           >> 0x20 == 0;
  if (!bVar14) {
    local_76._2_4_ = iVar13;
  }
  if (local_76._2_4_ == 0 && bVar14) {
    local_76[1] = (undefined1)((uVar3 & 0x100000) >> 0x14);
    iVar4 = 1;
    if (((ulong)fspecs & 0x10000000000000) == 0) goto LAB_00112598;
  }
  else {
    local_76[1] = 1;
  }
  iVar4 = 2;
LAB_00112598:
  sVar8 = uVar9 + (uint)(iVar4 + local_76._2_4_);
  local_58.sign = &local_70;
  local_58.significand = (significand_type *)(local_76 + 1);
  local_58.significand_size = (int *)local_76;
  local_58.fp = (decimal_fp<float> *)(local_76 + 2);
  local_58.fspecs = (float_specs *)local_68;
  local_58.decimal_point = (char *)&local_6c;
  bVar7.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_4_&>
                 (out,specs,sVar8,sVar8,(anon_class_48_6_d9b5e731 *)&local_58);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar7.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 Char decimal_point) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = detail::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}